

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.cpp
# Opt level: O2

void __thiscall
gmlc::networking::SocketFactory::load_json_config_file(SocketFactory *this,string *file)

{
  string sStack_3b8;
  stringstream strbuf;
  undefined1 local_388 [376];
  ifstream ifs;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&ifs,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&strbuf);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  parse_json_config(this,&sStack_3b8);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strbuf);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void SocketFactory::load_json_config_file(std::string file)
{
    std::ifstream ifs(file);
    std::stringstream strbuf;
    strbuf << ifs.rdbuf();
    parse_json_config(strbuf.str());
}